

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.cpp
# Opt level: O3

void __thiscall ON_AerialPhotoImageFrustum::Unset(ON_AerialPhotoImageFrustum *this)

{
  double dVar1;
  undefined3 uVar2;
  uint uVar3;
  
  this->m_height = -1.23432101234321e+308;
  dVar1 = ON_2dPoint::UnsetPoint.y;
  this->m_corners[0].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[0].y = dVar1;
  dVar1 = ON_2dPoint::UnsetPoint.y;
  this->m_corners[1].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[1].y = dVar1;
  dVar1 = ON_2dPoint::UnsetPoint.y;
  this->m_corners[2].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[2].y = dVar1;
  dVar1 = ON_2dPoint::UnsetPoint.y;
  this->m_corners[3].x = ON_2dPoint::UnsetPoint.x;
  this->m_corners[3].y = dVar1;
  dVar1 = ON_UnitSystem::None.m_meters_per_custom_unit;
  uVar2 = ON_UnitSystem::None._1_3_;
  uVar3 = ON_UnitSystem::None.m_reserved;
  (this->m_unit_system).m_unit_system = ON_UnitSystem::None.m_unit_system;
  *(undefined3 *)&(this->m_unit_system).field_0x1 = uVar2;
  (this->m_unit_system).m_reserved = uVar3;
  (this->m_unit_system).m_meters_per_custom_unit = dVar1;
  ON_wString::operator=
            (&(this->m_unit_system).m_custom_unit_name,&ON_UnitSystem::None.m_custom_unit_name);
  return;
}

Assistant:

void ON_AerialPhotoImageFrustum::Unset()
{
  m_height = ON_UNSET_VALUE;
  m_corners[0] = ON_2dPoint::UnsetPoint;
  m_corners[1] = ON_2dPoint::UnsetPoint;
  m_corners[2] = ON_2dPoint::UnsetPoint;
  m_corners[3] = ON_2dPoint::UnsetPoint;
  m_unit_system = ON_UnitSystem::None;
}